

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

ElementObserverListBackInserter * __thiscall
Rml::ElementObserverListBackInserter::operator=
          (ElementObserverListBackInserter *this,Element *element)

{
  vector<Rml::ObserverPtr<Rml::Element>,_std::allocator<Rml::ObserverPtr<Rml::Element>_>_> *this_00;
  EnableObserverPtr<Rml::Element> local_20;
  Element *local_18;
  Element *element_local;
  ElementObserverListBackInserter *this_local;
  
  this_00 = this->elements;
  local_18 = element;
  element_local = (Element *)this;
  EnableObserverPtr<Rml::Element>::GetObserverPtr(&local_20);
  ::std::vector<Rml::ObserverPtr<Rml::Element>,_std::allocator<Rml::ObserverPtr<Rml::Element>_>_>::
  push_back(this_00,(value_type *)&local_20);
  ObserverPtr<Rml::Element>::~ObserverPtr((ObserverPtr<Rml::Element> *)&local_20);
  return this;
}

Assistant:

ElementObserverListBackInserter& operator=(Element* element)
	{
		elements->push_back(element->GetObserverPtr());
		return *this;
	}